

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deck.cpp
# Opt level: O2

void __thiscall Deck::Deck(Deck *this)

{
  uint i;
  int iVar1;
  uint j;
  int iVar2;
  Card card;
  int local_40;
  int local_3c;
  Card local_38;
  
  (this->m_deck).super__Vector_base<Card,_std::allocator<Card>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->m_deck).super__Vector_base<Card,_std::allocator<Card>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->m_deck).super__Vector_base<Card,_std::allocator<Card>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  for (iVar1 = 0; iVar1 != 4; iVar1 = iVar1 + 1) {
    for (iVar2 = 0; iVar2 != 0xd; iVar2 = iVar2 + 1) {
      local_40 = iVar2;
      local_3c = iVar1;
      Card::Card(&local_38,&local_3c,&local_40);
      std::vector<Card,_std::allocator<Card>_>::push_back(&this->m_deck,&local_38);
    }
  }
  return;
}

Assistant:

Deck::Deck()
{
    for (unsigned int i(0); i < SUIT_MAX; ++i)
    {
        for (unsigned int j(0); j < RANK_MAX; ++j)
        {
            Card card(i, j);
            m_deck.push_back(card);
        }
    }
}